

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zbuffer.hpp
# Opt level: O2

void __thiscall Render::ZRender::bindBuffers(ZRender *this,GLuint colorProgram)

{
  PFNGLUNIFORM1IPROC p_Var1;
  GLint GVar2;
  
  (*glad_glUseProgram)(colorProgram);
  (*glad_glActiveTexture)(0x84c2);
  p_Var1 = glad_glUniform1i;
  GVar2 = (*glad_glGetUniformLocation)(colorProgram,"depthBuffer");
  (*p_Var1)(GVar2,2);
  (*glad_glBindTexture)(0xde1,this->activeDepth);
  p_Var1 = glad_glUniform1i;
  GVar2 = (*glad_glGetUniformLocation)(colorProgram,"prevBuffer");
  (*p_Var1)(GVar2,3);
  (*glad_glActiveTexture)(0x84c3);
  (*glad_glBindTexture)(0xde1,this->colorBuffer);
  return;
}

Assistant:

void bindBuffers(GLuint colorProgram)
    {
      glUseProgram(colorProgram);
      glActiveTexture(GL_TEXTURE2);
      glUniform1i(glGetUniformLocation(colorProgram,"depthBuffer"),2);
      glBindTexture(GL_TEXTURE_2D,activeDepth);


      glUniform1i(glGetUniformLocation(colorProgram,"prevBuffer"),3);
      glActiveTexture(GL_TEXTURE3);
      glBindTexture(GL_TEXTURE_2D,colorBuffer);
    }